

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sensor.h
# Opt level: O3

void __thiscall Sensor::~Sensor(Sensor *this)

{
  pointer pcVar1;
  
  this->_vptr_Sensor = (_func_int **)&PTR__Sensor_0014fc40;
  free((this->R_).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data)
  ;
  pcVar1 = (this->name_)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(this->name_).field_2) {
    operator_delete(pcVar1);
    return;
  }
  return;
}

Assistant:

virtual ~Sensor() {}